

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

expected<const_Command_*,_Commands::MatchFailure> * __thiscall
Commands::match(expected<const_Command_*,_Commands::MatchFailure> *__return_storage_ptr__,
               Commands *this,Alternator *alternator,optional<const_SyntaxTree_&> *cmdnode,
               MatchArgumentList *args,SymTable *symtable,shared_ptr<Scope> *scope_ptr,
               Options *options)

{
  pointer ppCVar1;
  Command **cmd;
  pointer ppCVar2;
  optional<const_SyntaxTree_&> local_70;
  SyntaxTree *local_68;
  MatchFailure local_60;
  MatchFailure local_48;
  
  ppCVar2 = (alternator->super__Vector_base<const_Command_*,_std::allocator<const_Command_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (alternator->super__Vector_base<const_Command_*,_std::allocator<const_Command_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppCVar2 == ppCVar1) {
      local_68 = cmdnode->ref;
      hint_from((optional<const_SyntaxTree_&> *)&local_60);
      local_60.reason = NoAlternativeMatch;
      MatchFailure::MatchFailure(&local_48,&local_60);
      nonstd::expected<const_Command_*,_Commands::MatchFailure>::expected<true,_0>
                (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_48.context.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.context.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return __return_storage_ptr__;
    }
    local_70 = (optional<const_SyntaxTree_&>)cmdnode->ref;
    match(__return_storage_ptr__,this,*ppCVar2,&local_70,args,symtable,scope_ptr,options);
    if (__return_storage_ptr__->has_value != false) break;
    nonstd::expected<const_Command_*,_Commands::MatchFailure>::~expected(__return_storage_ptr__);
    ppCVar2 = ppCVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

auto Commands::match(const Alternator& alternator, optional<const SyntaxTree&> cmdnode, const MatchArgumentList& args,
                     const SymTable& symtable, const shared_ptr<Scope>& scope_ptr, const Options& options) const
                                                                                                -> expected<const Command*, MatchFailure>
{
    for(auto& cmd : alternator)
    {
        if(auto opt_command = this->match(*cmd, cmdnode, args, symtable, scope_ptr, options))
            return opt_command;
    }
    return make_unexpected(MatchFailure { hint_from(cmdnode), MatchFailure::NoAlternativeMatch });
}